

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_<float,int,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  unsigned_long *puVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble lVar12;
  double dVar13;
  ulong local_b8;
  ulong local_90;
  
  lVar7 = (long)Xc_indptr[col_num];
  lVar8 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  piVar1 = Xc_ind + lVar8;
  iVar3 = piVar1[-1];
  puVar2 = ix_arr + end + 1;
  puVar5 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2);
  local_90 = (end - st) + 1;
  lVar12 = (longdouble)0;
  local_b8 = 0;
  lVar11 = lVar12;
LAB_00263630:
  piVar6 = Xc_ind + lVar7;
  do {
    if (((puVar5 == puVar2) || (lVar7 == lVar8)) || ((ulong)(long)iVar3 < *puVar5)) {
LAB_00263799:
      if (local_b8 == 0) {
        *x_mean = 0.0;
        dVar13 = 0.0;
      }
      else {
        if (local_b8 < local_90) {
          lVar9 = (longdouble)(long)local_90 +
                  (longdouble)(float)(&DAT_003250d8)[(long)local_90 < 0];
          lVar10 = ((longdouble)(long)local_b8 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_b8 < 0]) / lVar9;
          lVar11 = lVar12 * lVar12 *
                   ((longdouble)1 - lVar10) *
                   ((longdouble)(long)local_b8 +
                   (longdouble)(float)(&DAT_003250d8)[(long)local_b8 < 0]) + lVar11;
          lVar12 = lVar12 * lVar10;
        }
        else {
          lVar9 = (longdouble)(long)local_90 +
                  (longdouble)(float)(&DAT_003250d8)[(long)local_90 < 0];
        }
        *x_mean = (double)lVar12;
        dVar13 = (double)SQRT(lVar11 / lVar9);
      }
      *x_sd = dVar13;
      return;
    }
    iVar4 = (int)*puVar5;
    if (*piVar6 == iVar4) {
      if ((uint)ABS(Xc[lVar7]) < 0x7f800000) {
        local_b8 = local_b8 + 1;
        lVar12 = ((longdouble)Xc[lVar7] - lVar12) /
                 ((longdouble)(long)local_b8 +
                 (longdouble)(float)(&DAT_003250d8)[(long)local_b8 < 0]) + lVar12;
        lVar9 = in_ST1;
        fmal();
        lVar11 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = lVar9;
      }
      else {
        local_90 = local_90 - 1;
      }
      if ((puVar5 == ix_arr + end) || (lVar7 == lVar8 + -1)) goto LAB_00263799;
      puVar5 = puVar5 + 1;
      piVar6 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar6 + 1,piVar1,puVar5);
      lVar7 = (long)piVar6 - (long)Xc_ind >> 2;
      goto LAB_00263630;
    }
    if (*piVar6 <= iVar4) break;
    puVar5 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar5 + 1,puVar2,piVar6);
  } while( true );
  piVar6 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar6 + 1,piVar1,puVar5);
  lVar7 = (long)piVar6 - (long)Xc_ind >> 2;
  goto LAB_00263630;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}